

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1EnforceMaxPage(PGroup *pGroup)

{
  uint *puVar1;
  PgHdr1 *pPVar2;
  PCache1 *pPVar3;
  PgHdr1 *pPVar4;
  PGroup *pPVar5;
  PgHdr1 *pPVar6;
  PgHdr1 **ppPVar7;
  PgHdr1 **ppPVar8;
  
  if (pGroup->nMaxPage < pGroup->nCurrentPage) {
    do {
      pPVar2 = pGroup->pLruTail;
      if (pPVar2 == (PgHdr1 *)0x0) {
        return;
      }
      pPVar3 = pPVar2->pCache;
      pPVar4 = pPVar2->pLruNext;
      pPVar5 = pPVar3->pGroup;
      pPVar6 = pPVar2->pLruPrev;
      ppPVar8 = &pPVar6->pLruNext;
      if (pPVar6 == (PgHdr1 *)0x0) {
        ppPVar8 = &pPVar5->pLruHead;
      }
      *ppPVar8 = pPVar4;
      ppPVar8 = &pPVar4->pLruPrev;
      if (pPVar4 == (PgHdr1 *)0x0) {
        ppPVar8 = &pPVar5->pLruTail;
      }
      *ppPVar8 = pPVar6;
      pPVar2->pLruNext = (PgHdr1 *)0x0;
      pPVar2->pLruPrev = (PgHdr1 *)0x0;
      pPVar2->isPinned = '\x01';
      puVar1 = &pPVar3->nRecyclable;
      *puVar1 = *puVar1 - 1;
      pPVar3 = pPVar2->pCache;
      ppPVar8 = pPVar3->apHash + (ulong)pPVar2->iKey % (ulong)pPVar3->nHash;
      do {
        ppPVar7 = ppPVar8;
        pPVar4 = *ppPVar7;
        ppPVar8 = &pPVar4->pNext;
      } while (pPVar4 != pPVar2);
      *ppPVar7 = *ppPVar8;
      pPVar3->nPage = pPVar3->nPage - 1;
      pPVar3 = pPVar2->pCache;
      pcache1Free((pPVar2->page).pBuf);
      if (pPVar3->bPurgeable != 0) {
        puVar1 = &pPVar3->pGroup->nCurrentPage;
        *puVar1 = *puVar1 - 1;
      }
    } while (pGroup->nMaxPage < pGroup->nCurrentPage);
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PGroup *pGroup){
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage && pGroup->pLruTail ){
    PgHdr1 *p = pGroup->pLruTail;
    assert( p->pCache->pGroup==pGroup );
    assert( p->isPinned==0 );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p);
    pcache1FreePage(p);
  }
}